

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int nng_stream_dialer_alloc_url(nng_stream_dialer **dp,nng_url *url)

{
  int iVar1;
  int local_24;
  int i;
  nng_url *url_local;
  nng_stream_dialer **dp_local;
  
  local_24 = 0;
  while( true ) {
    if (stream_drivers[local_24].scheme == (char *)0x0) {
      return 9;
    }
    iVar1 = strcmp(stream_drivers[local_24].scheme,url->u_scheme);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  iVar1 = (*stream_drivers[local_24].dialer_alloc)(dp,url);
  return iVar1;
}

Assistant:

int
nng_stream_dialer_alloc_url(nng_stream_dialer **dp, const nng_url *url)
{
	for (int i = 0; stream_drivers[i].scheme != NULL; i++) {
		if (strcmp(stream_drivers[i].scheme, url->u_scheme) == 0) {
			return (stream_drivers[i].dialer_alloc(dp, url));
		}
	}
	return (NNG_ENOTSUP);
}